

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserPOMDPFormat_Spirit.h
# Opt level: O0

void __thiscall
POMDPFormatParsing::ParserPOMDPFormat_Spirit::AddModels::operator()
          (AddModels *this,iterator_t *str,iterator_t *end)

{
  POMDPDiscrete *pPVar1;
  undefined8 *in_RDI;
  POMDPDiscrete *p;
  MultiAgentDecisionProcessDiscrete *in_stack_00000030;
  MultiAgentDecisionProcessDiscrete *in_stack_000000b0;
  
  pPVar1 = GetPOMDPDiscrete((ParserPOMDPFormat_Spirit *)*in_RDI);
  MultiAgentDecisionProcessDiscrete::CreateNewTransitionModel(in_stack_00000030);
  MultiAgentDecisionProcessDiscrete::CreateNewObservationModel(in_stack_000000b0);
  (**(code **)(*(long *)&(pPVar1->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete.
                         super_MultiAgentDecisionProcess + 0x178))();
  return;
}

Assistant:

void operator()(iterator_t str, iterator_t end) const
            {
                POMDPDiscrete* p = _m_po->GetPOMDPDiscrete();
                // add the transition model
                p->CreateNewTransitionModel();
                p->CreateNewObservationModel();
                p->CreateNewRewardModel();
                //if(DEBUG_POMDP_PARSE) _m_po->GetPOMDPDiscrete()->PrintInfo();
            }